

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_FundRawTransaction_Asset1_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_Asset1_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *in_R9;
  long *expected_predicate_value;
  undefined1 uVar5;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  char *address;
  uint32_t index;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  char *output_tx_hex;
  uint32_t append_txout_count;
  int64_t tx_fee_amount;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  undefined1 in_stack_000004a5;
  undefined1 in_stack_000004a6;
  undefined1 in_stack_000004a7;
  AssertionResult gtest_ar_16;
  uint32_t in_stack_000004bc;
  char *in_stack_000004c0;
  void *in_stack_000004c8;
  AssertionResult gtest_ar_15;
  char *in_stack_000004f0;
  AssertionResult gtest_ar_14;
  char *in_stack_00000510;
  uint32_t in_stack_00000518;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  string txid;
  Utxo *utxo;
  iterator __end2;
  iterator __begin2;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__range2;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  uint32_t target_asset_count;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  uint32_t vout1;
  char *txid1;
  int64_t amount;
  char *tx;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *create_handle;
  int64_t knapsack_min_change;
  double dust_fee_rate;
  double long_term_fee_rate;
  double effective_fee_rate;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  void *fund_handle;
  anon_class_1_0_00000001 convert_to_byte;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *kDescriptor;
  undefined1 in_stack_00000b5f;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff704;
  undefined4 in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff70c;
  undefined4 in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff714;
  void **in_stack_fffffffffffff718;
  undefined4 in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff724;
  undefined4 in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff72c;
  void *in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  undefined1 in_stack_fffffffffffff7c7;
  double in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d4;
  char *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  char *in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff820;
  undefined4 uVar6;
  char *in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff830;
  undefined4 uVar7;
  char *in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff854;
  char *in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff864;
  anon_class_1_0_00000001 *in_stack_fffffffffffff868;
  uint32_t asset_index;
  undefined7 in_stack_fffffffffffff870;
  undefined1 *handle_00;
  undefined8 in_stack_fffffffffffff8c0;
  undefined7 in_stack_fffffffffffff8c8;
  undefined1 in_stack_fffffffffffff8cf;
  void *in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  AssertHelper local_688;
  Message local_680;
  undefined4 local_674;
  AssertionResult local_670;
  AssertHelper local_660;
  Message local_658;
  undefined4 local_64c;
  AssertionResult local_648;
  AssertHelper local_638;
  Message local_630;
  AssertionResult local_628;
  AssertHelper local_618;
  Message local_610;
  AssertionResult local_608;
  AssertHelper local_5f8;
  Message local_5f0;
  AssertionResult local_5e8;
  AssertHelper local_5d8;
  Message local_5d0;
  undefined4 local_5c4;
  AssertionResult local_5c0;
  char *local_5b0;
  uint local_5a4;
  AssertHelper local_5a0;
  Message local_598;
  void **in_stack_fffffffffffffa70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa78;
  uint32_t in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa84;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa88;
  AssertionResult local_568;
  AssertHelper local_558;
  Message local_550;
  undefined4 local_544;
  AssertionResult local_540;
  AssertHelper local_530;
  Message local_528;
  undefined4 local_51c;
  AssertionResult local_518;
  char *local_508;
  uint local_4fc;
  undefined8 local_4f8;
  AssertHelper local_4f0;
  Message local_4e8;
  undefined4 local_4dc;
  AssertionResult local_4d8;
  AssertHelper local_4c8;
  Message local_4c0;
  undefined4 local_4b4;
  AssertionResult local_4b0;
  AssertHelper local_4a0;
  Message local_498;
  undefined4 local_48c;
  AssertionResult local_488;
  AssertHelper in_stack_fffffffffffffb88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb90;
  uint32_t in_stack_fffffffffffffb9c;
  uint32_t in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffba8;
  AssertHelper local_450;
  Message local_448;
  undefined4 local_43c;
  char **in_stack_fffffffffffffbc8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbd0;
  AssertHelper in_stack_fffffffffffffbd8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 uVar8;
  void *in_stack_fffffffffffffbf0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbf8;
  AssertHelper local_400;
  Message local_3f8;
  undefined4 local_3ec;
  AssertionResult local_3e8;
  AssertHelper local_3d8;
  Message local_3d0;
  undefined4 local_3c4;
  AssertionResult local_3c0;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined4 local_39c;
  AssertionResult local_398;
  AssertHelper local_388;
  Message local_380;
  undefined4 local_374;
  AssertionResult local_370;
  AssertHelper local_360;
  Message local_358;
  undefined4 local_34c;
  AssertionResult local_348;
  string local_338 [32];
  Txid local_318;
  string local_2f8;
  string local_2d8;
  reference local_2b8;
  Utxo *local_2b0;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_2a8;
  undefined1 *local_2a0;
  AssertHelper local_298;
  Message local_290;
  undefined8 local_288;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  AssertionResult local_258;
  undefined4 local_244;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  AssertionResult local_208;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  AssertionResult local_190;
  undefined4 local_17c;
  char *local_178;
  undefined8 local_170;
  char *local_168;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_129;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  long local_f0 [5];
  undefined1 local_c8 [24];
  undefined8 local_b0;
  string local_a0 [16];
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  AssertHelper in_stack_ffffffffffffff80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  AssertHelper local_58;
  Message local_50 [3];
  undefined4 local_34;
  AssertionResult local_30;
  int local_1c;
  long local_18;
  char *local_10;
  
  handle_00 = &stack0xfffffffffffff6f8;
  local_10 = 
  "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
  ;
  local_18 = 0;
  local_1c = CfdCreateHandle(in_stack_fffffffffffff718);
  local_34 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff718,
             (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
             (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3ce909);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x4cb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x3ce96c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ce9c1);
  uVar5 = local_18 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
             (bool *)in_stack_fffffffffffff6f8,(type *)0x3ce9f5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff98);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&stack0xffffffffffffff98,
               (AssertionResult *)"(NULL == handle)","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x4cc,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff80,(Message *)&stack0xffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string(local_a0);
    testing::Message::~Message((Message *)0x3ceaf1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ceb6c);
  local_b0 = 0;
  CfdGetElementsUtxoListByC((bool)in_stack_00000b5f);
  local_f0[4] = 0xbff0000000000000;
  local_f0[3] = 0xbff0000000000000;
  local_f0[2] = 0xbff0000000000000;
  local_f0[1] = 0xffffffffffffffff;
  local_f0[0] = 0;
  expected_predicate_value = local_f0;
  local_1c = CfdInitializeTransaction
                       (in_stack_fffffffffffffba8.ptr_,in_stack_fffffffffffffba4,
                        in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                        (char *)in_stack_fffffffffffffb90.ptr_,
                        (void **)in_stack_fffffffffffffb88.data_);
  local_104 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff718,
             (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
             (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3ceccd);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x4e6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x3ced30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ced85);
  local_129 = local_f0[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
             (bool *)in_stack_fffffffffffff6f8,(type *)0x3cedb1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_160,(internal *)&local_128,(AssertionResult *)"(NULL == create_handle)","true"
               ,"false",(char *)expected_predicate_value);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x4e7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    testing::Message::~Message((Message *)0x3ceeaf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cef2a);
  local_168 = (char *)0x0;
  local_170 = 0x6b22c20;
  local_178 = "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff";
  local_17c = 0;
  if (local_1c == 0) {
    local_1c = CfdAddTransactionInput
                         ((void *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                          in_stack_fffffffffffff8d0,
                          (char *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                          (uint32_t)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                          (uint32_t)in_stack_fffffffffffff8c0);
    local_194 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3cf052);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x4ef,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      testing::Message::~Message((Message *)0x3cf0b5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cf10d);
    local_1c = CfdAddTransactionOutput
                         (in_stack_ffffffffffffff98,
                          (void *)CONCAT17(uVar5,in_stack_ffffffffffffff90),
                          (int64_t)in_stack_ffffffffffffff88.ptr_,
                          (char *)in_stack_ffffffffffffff80.data_,(char *)in_stack_ffffffffffffff78,
                          (char *)in_stack_ffffffffffffff70);
    local_1bc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
    if (!bVar1) {
      testing::Message::Message(&local_1c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3cf1fb);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x4f3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      testing::Message::~Message((Message *)0x3cf25e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cf2b6);
    local_1c = CfdFinalizeTransaction
                         ((void *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                          in_stack_fffffffffffff6f8,(char **)0x3cf2d3);
    local_1e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3cf391);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x4f5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message((Message *)0x3cf3f4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cf449);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_208,
               "\"010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000\""
               ,"tx",
               "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
               ,local_168);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
    if (!bVar1) {
      testing::Message::Message(&local_210);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3cf4e4);
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x4f6,pcVar4);
      testing::internal::AssertHelper::operator=(&local_218,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      testing::Message::~Message((Message *)0x3cf547);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cf59f);
    local_1c = CfdFreeTransactionHandle
                         ((void *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                          in_stack_fffffffffffff6f8);
    local_22c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3cf672);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x4f8,pcVar4);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x3cf6d5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cf72a);
  }
  local_244 = 3;
  if (local_1c == 0) {
    local_1c = CfdInitializeFundRawTx
                         (in_stack_fffffffffffffa88.ptr_,in_stack_fffffffffffffa84,
                          in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78.ptr_,
                          in_stack_fffffffffffffa70);
    local_25c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message(&local_268);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3cf82b);
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x500,pcVar4);
      testing::internal::AssertHelper::operator=(&local_270,&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      testing::Message::~Message((Message *)0x3cf88e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cf8e3);
    local_288 = 0;
    testing::internal::CmpHelperNE<decltype(nullptr),void*>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (void **)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (void **)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
    if (!bVar1) {
      testing::Message::Message(&local_290);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3cf98b);
      testing::internal::AssertHelper::AssertHelper
                (&local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x501,pcVar4);
      testing::internal::AssertHelper::operator=(&local_298,&local_290);
      testing::internal::AssertHelper::~AssertHelper(&local_298);
      testing::Message::~Message((Message *)0x3cf9ee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cfa43);
  }
  if (local_1c == 0) {
    local_2a0 = local_c8;
    local_2a8._M_current =
         (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                           (in_stack_fffffffffffff6f8);
    local_2b0 = (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::end
                                  (in_stack_fffffffffffff6f8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                               *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                              (__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                               *)in_stack_fffffffffffff6f8), bVar1) {
      local_2b8 = __gnu_cxx::
                  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                  ::operator*(&local_2a8);
      TestBody()::$_0::operator()[abi_cxx11_
                (in_stack_fffffffffffff868,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                 (size_t)in_stack_fffffffffffff858);
      cfd::core::Txid::Txid(&local_318,&local_2d8);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_2f8,&local_318);
      std::__cxx11::string::c_str();
      TestBody()::$_0::operator()[abi_cxx11_
                (in_stack_fffffffffffff868,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                 (size_t)in_stack_fffffffffffff858);
      in_stack_fffffffffffff6f8 =
           (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)std::__cxx11::string::c_str();
      local_1c = CfdAddUtxoForFundRawTx
                           (in_stack_fffffffffffff730,
                            (void *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                            (char *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (uint32_t)((ulong)in_stack_fffffffffffff718 >> 0x20),
                            CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                            (char *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                            (char *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string((string *)&local_2f8);
      cfd::core::Txid::~Txid((Txid *)0x3cfc28);
      local_34c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff718,
                 (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                 (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                 (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
      if (!bVar1) {
        testing::Message::Message(&local_358);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3cfd45);
        testing::internal::AssertHelper::AssertHelper
                  (&local_360,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x50d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_360,&local_358);
        testing::internal::AssertHelper::~AssertHelper(&local_360);
        testing::Message::~Message((Message *)0x3cfda8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cfdfd);
      std::__cxx11::string::~string((string *)&local_2d8);
      __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
      ::operator++(&local_2a8);
    }
    in_stack_fffffffffffff718 = (void **)0x89756b;
    in_stack_fffffffffffff710 = 0;
    in_stack_fffffffffffff708 = 0;
    in_stack_fffffffffffff700 = 0;
    local_1c = CfdAddTxInputForFundRawTx
                         ((void *)gtest_ar_15._0_8_,in_stack_000004c8,in_stack_000004c0,
                          in_stack_000004bc,(int64_t)gtest_ar_16.message_.ptr_,
                          (char *)gtest_ar_16._0_8_,in_stack_000004f0,(bool)in_stack_000004a7,
                          (bool)in_stack_000004a6,(bool)in_stack_000004a5,in_stack_00000510,
                          in_stack_00000518,gtest_ar_13._0_4_,(char *)gtest_ar_13.message_.ptr_);
    asset_index = (uint32_t)((ulong)in_stack_fffffffffffff868 >> 0x20);
    local_374 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_370);
    if (!(bool)uVar5) {
      testing::Message::Message(&local_380);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3cff5f);
      testing::internal::AssertHelper::AssertHelper
                (&local_388,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x514,pcVar4);
      asset_index = (uint32_t)((ulong)pcVar4 >> 0x20);
      testing::internal::AssertHelper::operator=(&local_388,&local_380);
      testing::internal::AssertHelper::~AssertHelper(&local_388);
      testing::Message::~Message((Message *)0x3cffc2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d001a);
    iVar2 = CfdAddTargetAmountForFundRawTx
                      (handle_00,(void *)CONCAT17(uVar5,in_stack_fffffffffffff870),asset_index,
                       CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                       in_stack_fffffffffffff858,
                       (char *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    local_39c = 0;
    local_1c = iVar2;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
    uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff860);
    if (!bVar1) {
      testing::Message::Message(&local_3a8);
      in_stack_fffffffffffff858 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3d0102);
      testing::internal::AssertHelper::AssertHelper
                (&local_3b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x518,in_stack_fffffffffffff858);
      testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper(&local_3b0);
      testing::Message::~Message((Message *)0x3d0165);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d01bd);
    iVar3 = CfdAddTargetAmountForFundRawTx
                      (handle_00,(void *)CONCAT17(uVar5,in_stack_fffffffffffff870),asset_index,
                       CONCAT44(iVar2,uVar7),in_stack_fffffffffffff858,
                       (char *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    local_3c4 = 0;
    local_1c = iVar3;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
    uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff850);
    if (!bVar1) {
      testing::Message::Message(&local_3d0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d02a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x51b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_3d8);
      testing::Message::~Message((Message *)0x3d030b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d0363);
    local_1c = CfdAddTargetAmountForFundRawTx
                         (handle_00,(void *)CONCAT17(uVar5,in_stack_fffffffffffff870),asset_index,
                          CONCAT44(iVar2,uVar7),in_stack_fffffffffffff858,
                          (char *)CONCAT44(iVar3,uVar8));
    local_3ec = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e8);
    if (!bVar1) {
      testing::Message::Message(&local_3f8);
      in_stack_fffffffffffff838 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3d044e);
      testing::internal::AssertHelper::AssertHelper
                (&local_400,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x51e,in_stack_fffffffffffff838);
      testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
      testing::internal::AssertHelper::~AssertHelper(&local_400);
      testing::Message::~Message((Message *)0x3d04b1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d0509);
    iVar2 = CfdSetOptionFundRawTx
                      (in_stack_fffffffffffff7e8,
                       (void *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                       (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                       CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       in_stack_fffffffffffff7c8,(bool)in_stack_fffffffffffff7c7);
    uVar8 = 0;
    local_1c = iVar2;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffbf0);
    uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff830);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffbe0);
      in_stack_fffffffffffff828 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3d05ec);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x522,in_stack_fffffffffffff828);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&stack0xfffffffffffffbe0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
      testing::Message::~Message((Message *)0x3d064f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d06a7);
    iVar3 = CfdSetOptionFundRawTx
                      (in_stack_fffffffffffff7e8,
                       (void *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                       (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                       CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       in_stack_fffffffffffff7c8,(bool)in_stack_fffffffffffff7c7);
    local_43c = 0;
    local_1c = iVar3;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffbc8);
    uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff820);
    if (!bVar1) {
      testing::Message::Message(&local_448);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d078e);
      testing::internal::AssertHelper::AssertHelper
                (&local_450,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x525,pcVar4);
      testing::internal::AssertHelper::operator=(&local_450,&local_448);
      testing::internal::AssertHelper::~AssertHelper(&local_450);
      testing::Message::~Message((Message *)0x3d07f1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d0849);
    local_1c = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffff7e8,
                          (void *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                          (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                          CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                          in_stack_fffffffffffff7c8,(bool)in_stack_fffffffffffff7c7);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffba0);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffb90);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d0930);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffb88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x528,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffb88,(Message *)&stack0xfffffffffffffb90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb88);
      testing::Message::~Message((Message *)0x3d0993);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d09eb);
    local_1c = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffff7e8,
                          (void *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                          (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                          CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                          in_stack_fffffffffffff7c8,(bool)in_stack_fffffffffffff7c7);
    local_48c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_488);
    if (!bVar1) {
      testing::Message::Message(&local_498);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d0ad1);
      testing::internal::AssertHelper::AssertHelper
                (&local_4a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x52b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
      testing::internal::AssertHelper::~AssertHelper(&local_4a0);
      testing::Message::~Message((Message *)0x3d0b34);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d0b8c);
    local_1c = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffff7e8,
                          (void *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                          (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                          CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                          in_stack_fffffffffffff7c8,(bool)in_stack_fffffffffffff7c7);
    local_4b4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b0);
    if (!bVar1) {
      testing::Message::Message(&local_4c0);
      in_stack_fffffffffffff7e8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3d0c6d);
      testing::internal::AssertHelper::AssertHelper
                (&local_4c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x52e,in_stack_fffffffffffff7e8);
      testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
      testing::internal::AssertHelper::~AssertHelper(&local_4c8);
      testing::Message::~Message((Message *)0x3d0cd0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d0d28);
    local_1c = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffff7e8,
                          (void *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                          (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                          CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                          in_stack_fffffffffffff7c8,(bool)in_stack_fffffffffffff7c7);
    local_4dc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4d8);
    if (!bVar1) {
      testing::Message::Message(&local_4e8);
      in_stack_fffffffffffff7d8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3d0e0b);
      testing::internal::AssertHelper::AssertHelper
                (&local_4f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x531,in_stack_fffffffffffff7d8);
      testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
      testing::internal::AssertHelper::~AssertHelper(&local_4f0);
      testing::Message::~Message((Message *)0x3d0e6e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d0ec6);
    local_4f8 = 0;
    local_4fc = 0;
    local_508 = (char *)0x0;
    in_stack_fffffffffffff7d4 =
         CfdFinalizeFundRawTx
                   (in_stack_fffffffffffffbf8.ptr_,in_stack_fffffffffffffbf0,
                    (char *)CONCAT44(uVar8,in_stack_fffffffffffffbe8),
                    (double)in_stack_fffffffffffffbe0.ptr_,
                    (int64_t *)in_stack_fffffffffffffbd8.data_,
                    (uint32_t *)in_stack_fffffffffffffbd0.ptr_,in_stack_fffffffffffffbc8);
    local_51c = 0;
    local_1c = in_stack_fffffffffffff7d4;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_518);
    in_stack_fffffffffffff7d0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7d0);
    if (!bVar1) {
      testing::Message::Message(&local_528);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d0fe5);
      testing::internal::AssertHelper::AssertHelper
                (&local_530,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x539,pcVar4);
      testing::internal::AssertHelper::operator=(&local_530,&local_528);
      testing::internal::AssertHelper::~AssertHelper(&local_530);
      testing::Message::~Message((Message *)0x3d1048);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d109d);
    local_544 = 0x1a5f4;
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (int *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (long *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_540);
    if (!bVar1) {
      testing::Message::Message(&local_550);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d1144);
      testing::internal::AssertHelper::AssertHelper
                (&local_558,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x53a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_558,&local_550);
      testing::internal::AssertHelper::~AssertHelper(&local_558);
      testing::Message::~Message((Message *)0x3d11a7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d11fc);
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff718,
               (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
               (int *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
               (uint *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_568);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffa88);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d12a3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffa80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x53b,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffa80,(Message *)&stack0xfffffffffffffa88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffa80);
      testing::Message::~Message((Message *)0x3d1306);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d135b);
    if (local_1c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffa70,
                 "\"010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000001a5f400000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fa7db8001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000\""
                 ,"output_tx_hex",
                 "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000001a5f400000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fa7db8001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
                 ,local_508);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffa70);
      if (!bVar1) {
        testing::Message::Message(&local_598);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d1404);
        testing::internal::AssertHelper::AssertHelper
                  (&local_5a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x53d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
        testing::internal::AssertHelper::~AssertHelper(&local_5a0);
        testing::Message::~Message((Message *)0x3d1467);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d14bc);
      CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
    }
    for (local_5a4 = 0; local_5a4 < local_4fc; local_5a4 = local_5a4 + 1) {
      local_5b0 = (char *)0x0;
      local_1c = CfdGetAppendTxOutFundRawTx
                           (in_stack_fffffffffffff838,(void *)CONCAT44(iVar2,uVar7),
                            (uint32_t)((ulong)in_stack_fffffffffffff828 >> 0x20),
                            (char **)CONCAT44(iVar3,uVar6));
      local_5c4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff718,
                 (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                 (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                 (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5c0);
      if (!bVar1) {
        testing::Message::Message(&local_5d0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d15da);
        testing::internal::AssertHelper::AssertHelper
                  (&local_5d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x544,pcVar4);
        testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
        testing::internal::AssertHelper::~AssertHelper(&local_5d8);
        testing::Message::~Message((Message *)0x3d163d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d1692);
      if (local_1c == 0) {
        if (local_5a4 == 0) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_5e8,"\"ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn\"",
                     "address","ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn",local_5b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5e8);
          if (!bVar1) {
            testing::Message::Message(&local_5f0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d1749);
            testing::internal::AssertHelper::AssertHelper
                      (&local_5f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x547,pcVar4);
            testing::internal::AssertHelper::operator=(&local_5f8,&local_5f0);
            testing::internal::AssertHelper::~AssertHelper(&local_5f8);
            testing::Message::~Message((Message *)0x3d17ac);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d1801);
        }
        else if (local_5a4 == 1) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_608,"\"ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m\"",
                     "address","ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m",local_5b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_608);
          if (!bVar1) {
            testing::Message::Message(&local_610);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d18a9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_618,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x549,pcVar4);
            testing::internal::AssertHelper::operator=(&local_618,&local_610);
            testing::internal::AssertHelper::~AssertHelper(&local_618);
            testing::Message::~Message((Message *)0x3d1906);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d195b);
        }
        else if (local_5a4 == 2) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_628,"\"ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e\"",
                     "address","ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e",local_5b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_628);
          if (!bVar1) {
            testing::Message::Message(&local_630);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d1a03);
            testing::internal::AssertHelper::AssertHelper
                      (&local_638,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x54b,pcVar4);
            testing::internal::AssertHelper::operator=(&local_638,&local_630);
            testing::internal::AssertHelper::~AssertHelper(&local_638);
            testing::Message::~Message((Message *)0x3d1a60);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d1ab5);
        }
      }
      CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
    }
  }
  local_1c = CfdFreeFundRawTxHandle
                       (in_stack_fffffffffffff7d8,
                        (void *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  local_64c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff718,
             (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
             (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_648);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d1bad);
    testing::internal::AssertHelper::AssertHelper
              (&local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x552,pcVar4);
    testing::internal::AssertHelper::operator=(&local_660,&local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_660);
    testing::Message::~Message((Message *)0x3d1c0a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d1c62);
  CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
  local_1c = CfdFreeHandle((void *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
  local_674 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff718,
             (char *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
             (int *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_670);
  if (!bVar1) {
    testing::Message::Message(&local_680);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d1d30);
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x557,pcVar4);
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    testing::Message::~Message((Message *)0x3d1d8d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d1de2);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
             CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710));
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_Asset1) {
  constexpr const char* kDescriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  auto convert_to_byte = [](const uint8_t* byte_array, size_t size) -> std::string {
    if (size == 32) {
      std::vector<uint8_t> bytes(size);
      memcpy(bytes.data(), byte_array, bytes.size());
      std::vector<uint8_t> reverse_buffer(bytes.crbegin(), bytes.crend());
      return ByteData(reverse_buffer).GetHex();
    } else {
      std::vector<uint8_t> bytes(32);
      memcpy(bytes.data(), byte_array + 1, bytes.size());
      std::vector<uint8_t> reverse_buffer(bytes.crbegin(), bytes.crend());
      return ByteData(reverse_buffer).GetHex();
    }
  };

  void* fund_handle = nullptr;
  std::vector<Utxo> utxos = CfdGetElementsUtxoListByC(true);
  double effective_fee_rate = -1;
  double long_term_fee_rate = -1;
  double dust_fee_rate = -1;
  int64_t knapsack_min_change = -1;

  void* create_handle = nullptr;
  ret = CfdInitializeTransaction(
      handle, kCfdNetworkLiquidv1, 1, 17, nullptr, &create_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == create_handle));

  char* tx = nullptr;
  int64_t amount = 112340000;
  const char* txid1 = "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff";
  uint32_t vout1 = 0;
  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(handle, create_handle, txid1, vout1, 0xfffffffe);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddTransactionOutput(
        handle, create_handle, amount, "ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h",
        nullptr, exp_dummytx_asset_ca);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdFinalizeTransaction(handle, create_handle, &tx);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000", tx);
    ret = CfdFreeTransactionHandle(handle, create_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  uint32_t target_asset_count = 3;
  if (ret == kCfdSuccess) {
    ret = CfdInitializeFundRawTx(
        handle, kCfdNetworkLiquidv1, target_asset_count,
        exp_dummytx_asset_ca, &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_NE(nullptr, fund_handle);
  }

  if (ret == kCfdSuccess) {
    for (const auto& utxo : utxos) {
      std::string txid = convert_to_byte(utxo.txid, sizeof(utxo.txid));
      ret = CfdAddUtxoForFundRawTx(
          handle, fund_handle,
          Txid(txid).GetHex().c_str(), utxo.vout,
          utxo.amount,
          kDescriptor,
          convert_to_byte(utxo.asset, sizeof(utxo.asset)).c_str());
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdAddTxInputForFundRawTx(handle, fund_handle,
        "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff", 0,
        amount,  kDescriptor, exp_dummytx_asset_ca,
        false, false, false, "", 0, 0, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0, 115800000,
        exp_dummytx_asset_ca, "ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 1, 347180040,
        exp_dummytx_asset_cb, "ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 2, 37654100,
        exp_dummytx_asset_cc, "ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
        0, 0, true);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxDustFeeRate,
        0, dust_fee_rate, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxLongTermFeeRate,
        0, long_term_fee_rate, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxKnapsackMinChange,
        knapsack_min_change, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxBlindExponent,
        0, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxBlindMinimumBits,
        52, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t tx_fee_amount = 0;
    uint32_t append_txout_count = 0;
    char* output_tx_hex = nullptr;
    ret = CfdFinalizeFundRawTx(handle, fund_handle, tx,
        effective_fee_rate, &tx_fee_amount, &append_txout_count,
        &output_tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(108020, tx_fee_amount);
    EXPECT_EQ(3, append_txout_count);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000001a5f400000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fa7db8001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000", output_tx_hex);
      CfdFreeStringBuffer(output_tx_hex);
    }

    for (uint32_t index = 0; index < append_txout_count; ++index) {
      char* address = nullptr;
      ret = CfdGetAppendTxOutFundRawTx(handle, fund_handle, index, &address);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        if (index == 0) {
          EXPECT_STREQ("ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn", address);
        } else if (index == 1) {
          EXPECT_STREQ("ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m", address);
        } else if (index == 2) {
          EXPECT_STREQ("ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e", address);
        }
      }
      CfdFreeStringBuffer(address);
    }
  }
  ret = CfdFreeFundRawTxHandle(handle, fund_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  CfdFreeStringBuffer(tx);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}